

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsView::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsView *this,QRect *rect,
          ItemSelectionMode mode)

{
  QPointer *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  QGraphicsScene *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointF> local_a0;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = (QPointer *)(lVar1 + 0x490);
  bVar3 = QPointer::operator_cast_to_bool(this_00);
  if (bVar3) {
    lVar2 = *(long *)this_00;
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      this_01 = (QGraphicsScene *)0x0;
    }
    else {
      this_01 = *(QGraphicsScene **)(lVar1 + 0x498);
    }
    mapToScene((QPolygonF *)&local_a0,this,rect);
    viewportTransform(&local_88,this);
    QGraphicsScene::items
              (__return_storage_ptr__,this_01,(QPolygonF *)&local_a0,mode,DescendingOrder,&local_88)
    ;
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_a0);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_005bdf65:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_005bdf65;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsView::items(const QRect &rect, Qt::ItemSelectionMode mode) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QList<QGraphicsItem *>();
    return d->scene->items(mapToScene(rect), mode, Qt::DescendingOrder, viewportTransform());
}